

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  Reader node_00;
  Reader node_01;
  bool bVar1;
  uint16_t uVar2;
  ArrayPtr<capnp::word> AVar3;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  Reader structNode;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> local_30;
  RequiredSize *local_28;
  RequiredSize *requirement;
  Impl *this_local;
  
  requirement = (RequiredSize *)this;
  bVar1 = capnp::schema::Node::Reader::isStruct(&node);
  if (bVar1) {
    structNode._reader._40_8_ = capnp::schema::Node::Reader::getId(&node);
    local_30 = kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::
               find<unsigned_long>(&this->structSizeRequirements,
                                   (unsigned_long *)&structNode._reader.nestingLimit);
    local_28 = kj::_::readMaybe<capnp::SchemaLoader::Impl::RequiredSize>(&local_30);
    if (local_28 != (RequiredSize *)0x0) {
      capnp::schema::Node::Reader::getStruct((Reader *)local_68,&node);
      uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_68);
      if ((uVar2 < local_28->dataWordCount) ||
         (uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_68),
         uVar2 < local_28->pointerCount)) {
        memcpy(&local_98,&node,0x30);
        node_00._reader.capTable = (CapTableReader *)uStack_90;
        node_00._reader.segment = (SegmentReader *)local_98;
        node_00._reader.data = (void *)local_88;
        node_00._reader.pointers = (WirePointer *)uStack_80;
        node_00._reader.dataSize = (undefined4)local_78;
        node_00._reader.pointerCount = local_78._4_2_;
        node_00._reader._38_2_ = local_78._6_2_;
        node_00._reader._40_8_ = uStack_70;
        AVar3 = rewriteStructNodeWithSizes
                          (this,node_00,(uint)local_28->dataWordCount,(uint)local_28->pointerCount);
        return AVar3;
      }
    }
  }
  memcpy(&local_c8,&node,0x30);
  node_01._reader.capTable = (CapTableReader *)uStack_c0;
  node_01._reader.segment = (SegmentReader *)local_c8;
  node_01._reader.data = (void *)local_b8;
  node_01._reader.pointers = (WirePointer *)uStack_b0;
  node_01._reader.dataSize = (undefined4)local_a8;
  node_01._reader.pointerCount = local_a8._4_2_;
  node_01._reader._38_2_ = local_a8._6_2_;
  node_01._reader._40_8_ = uStack_a0;
  AVar3 = makeUncheckedNode(this,node_01);
  return AVar3;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_MAYBE(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement->dataWordCount ||
          structNode.getPointerCount() < requirement->pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement->dataWordCount,
                                          requirement->pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}